

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Ptr * __thiscall
wabt::interp::Instance::Instantiate
          (Ptr *__return_storage_ptr__,Instance *this,Store *store,Ref module,RefVec *imports,
          Ptr *out_trap)

{
  pointer pIVar1;
  FuncDesc *pFVar2;
  pointer pTVar3;
  pointer pMVar4;
  pointer pGVar5;
  TagType *pTVar6;
  pointer pEVar7;
  pointer pEVar8;
  pointer pDVar9;
  ElemSegment *pEVar10;
  ElemDesc *pEVar11;
  DataSegment *pDVar12;
  DataDesc *pDVar13;
  pointer pSVar14;
  uint64_t uVar15;
  bool bVar16;
  int iVar17;
  Result RVar18;
  ulong uVar19;
  long lVar20;
  Ref RVar21;
  pointer pRVar22;
  FuncDesc *desc;
  long lVar23;
  FuncDesc *pFVar24;
  pointer pGVar25;
  TagType *pTVar26;
  undefined8 uVar27;
  ulong uVar28;
  ElemSegment *src;
  DataSegment *src_00;
  Instance *pIVar29;
  RefVec *pRVar30;
  Instance *pIVar31;
  pointer pSVar32;
  ExportDesc *desc_4;
  pointer pEVar33;
  pointer pDVar34;
  uint uVar35;
  TableDesc *desc_1;
  pointer pTVar36;
  pointer pMVar37;
  pointer pEVar38;
  Value value_00;
  Ptr inst;
  Value value;
  pointer local_358;
  Ptr extern_;
  Ptr mod;
  Ref extern_ref;
  Value value_1;
  Ptr local_2d8;
  long *local_2c0;
  undefined **local_2b8;
  ExternKind local_2b0;
  undefined8 local_2ac;
  Mutability local_2a4;
  Ref module_local;
  MemoryType local_298;
  TableType local_268;
  TagType local_238;
  undefined1 local_210 [360];
  FuncDesc local_a8;
  
  module_local.index = (size_t)store;
  RefPtr<wabt::interp::Module>::RefPtr(&mod,(Store *)this,(Ref)store);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&inst,(Store *)this,(Store *)this,&module_local);
  uVar19 = ((long)((mod.obj_)->desc_).imports.
                  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)((mod.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x48;
  local_2c0 = (long *)module.index;
  if ((ulong)(*(long *)(module.index + 8) - *(long *)module.index >> 3) < uVar19) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extern_,"not enough imports!",(allocator<char> *)&extern_ref);
    local_2d8.obj_ = (Trap *)0x0;
    local_2d8.store_ = (Store *)0x0;
    local_2d8.root_index_ = 0;
    Trap::New((Ptr *)&value,(Store *)this,(string *)&extern_,
              (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_2d8);
    (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)value.field_0.i64_;
    (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)value.field_0._8_8_;
    (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_358;
    value.field_0.i64_ = 0;
    value.field_0._8_8_ = 0;
    RefPtr<wabt::interp::Trap>::reset((Ptr *)&value);
    std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
              ((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_2d8
              );
    std::__cxx11::string::_M_dispose();
    __return_storage_ptr__->obj_ = (Instance *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
  }
  else {
    lVar23 = 0;
    uVar28 = 0;
    while (uVar19 != uVar28) {
      pIVar1 = ((mod.obj_)->desc_).imports.
               super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      extern_ref.index = *(size_t *)(*local_2c0 + uVar28 * 8);
      if (extern_ref.index == 0) {
        StringPrintf_abi_cxx11_
                  ((string *)&extern_,"invalid import \"%s.%s\"",
                   *(undefined8 *)((long)&(pIVar1->type).module._M_dataplus._M_p + lVar23),
                   *(undefined8 *)((long)&(pIVar1->type).name._M_dataplus._M_p + lVar23));
        local_2d8.obj_ = (Trap *)0x0;
        local_2d8.store_ = (Store *)0x0;
        local_2d8.root_index_ = 0;
        Trap::New((Ptr *)&value,(Store *)this,(string *)&extern_,
                  (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_2d8);
        (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl
        .super__Vector_impl_data._M_start = (pointer)value.field_0.i64_;
        (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl
        .super__Vector_impl_data._M_finish = (pointer)value.field_0._8_8_;
        (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)local_358;
        value.field_0.i64_ = 0;
        value.field_0._8_8_ = 0;
        RefPtr<wabt::interp::Trap>::reset((Ptr *)&value);
        std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
                  ((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &local_2d8);
        std::__cxx11::string::_M_dispose();
        goto LAB_00123fc8;
      }
      RefPtr<wabt::interp::Extern>::RefPtr(&extern_,(Store *)this,extern_ref);
      iVar17 = (*((extern_.obj_)->super_Object)._vptr_Object[3])
                         (extern_.obj_,this,(long)&(pIVar1->type).module._M_dataplus._M_p + lVar23,
                          imports);
      if (iVar17 == 1) {
        __return_storage_ptr__->obj_ = (Instance *)0x0;
        __return_storage_ptr__->store_ = (Store *)0x0;
        __return_storage_ptr__->root_index_ = 0;
        goto switchD_0012374d_default;
      }
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&(inst.obj_)->imports_,&extern_ref);
      switch(*(undefined4 *)
              (*(long *)((long)&(pIVar1->type).type._M_t.
                                super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                                .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>.
                                _M_head_impl + lVar23) + 8)) {
      case 0:
        pRVar30 = &(inst.obj_)->funcs_;
        goto LAB_0012378a;
      case 1:
        pRVar30 = &(inst.obj_)->tables_;
        goto LAB_0012378a;
      case 2:
        lVar20 = 0x90;
        break;
      case 3:
        lVar20 = 0xa8;
        break;
      case 4:
        lVar20 = 0xc0;
        break;
      default:
        goto switchD_0012374d_default;
      }
      pRVar30 = (RefVec *)((long)&((inst.obj_)->super_Object)._vptr_Object + lVar20);
LAB_0012378a:
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (pRVar30,&extern_ref);
switchD_0012374d_default:
      RefPtr<wabt::interp::Extern>::reset(&extern_);
      uVar28 = uVar28 + 1;
      lVar23 = lVar23 + 0x48;
      if (iVar17 == 1) goto LAB_00123fd0;
    }
    pFVar2 = ((mod.obj_)->desc_).funcs.
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pFVar24 = ((mod.obj_)->desc_).funcs.
                   super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar24 != pFVar2;
        pFVar24 = pFVar24 + 1) {
      pRVar30 = &(inst.obj_)->funcs_;
      RVar21 = RefPtr<wabt::interp::Instance>::ref(&inst);
      FuncDesc::FuncDesc(&local_a8,pFVar24);
      DefinedFunc::New((Ptr *)&extern_,(Store *)this,RVar21,&local_a8);
      value.field_0.ref_ = RefPtr<wabt::interp::DefinedFunc>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar30,(Ref *)&value);
      RefPtr<wabt::interp::DefinedFunc>::reset((Ptr *)&extern_);
      FuncDesc::~FuncDesc(&local_a8);
    }
    pTVar3 = ((mod.obj_)->desc_).tables.
             super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar36 = ((mod.obj_)->desc_).tables.
                   super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pTVar36 != pTVar3;
        pTVar36 = pTVar36 + 1) {
      pRVar30 = &(inst.obj_)->tables_;
      local_268.super_ExternType.kind = (pTVar36->type).super_ExternType.kind;
      local_268.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00186100;
      local_268._12_8_ = *(undefined8 *)&(pTVar36->type).super_ExternType.field_0xc;
      uVar27 = *(undefined8 *)&(pTVar36->type).field_0x14;
      local_268.limits._11_8_ = *(undefined8 *)((long)&(pTVar36->type).limits.max + 3);
      local_268.limits._4_7_ =
           SUB87((ulong)*(undefined8 *)((long)&(pTVar36->type).limits.initial + 3) >> 8,0);
      local_268._20_7_ = SUB87(uVar27,0);
      local_268.limits.initial._3_1_ = (undefined1)((ulong)uVar27 >> 0x38);
      Table::New((Ptr *)&extern_,(Store *)this,&local_268);
      value.field_0.ref_ = RefPtr<wabt::interp::Table>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar30,(Ref *)&value);
      RefPtr<wabt::interp::Table>::reset((Ptr *)&extern_);
    }
    pMVar4 = ((mod.obj_)->desc_).memories.
             super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar37 = ((mod.obj_)->desc_).memories.
                   super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar37 != pMVar4;
        pMVar37 = pMVar37 + 1) {
      pRVar30 = &(inst.obj_)->memories_;
      local_298.super_ExternType.kind = (pMVar37->type).super_ExternType.kind;
      local_298.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00186140;
      local_298.limits.initial = (pMVar37->type).limits.initial;
      uVar15 = (pMVar37->type).limits.max;
      local_298._36_8_ = *(undefined8 *)&(pMVar37->type).limits.field_0x14;
      local_298.limits._16_4_ =
           SUB84((ulong)*(undefined8 *)((long)&(pMVar37->type).limits.max + 4) >> 0x20,0);
      local_298.limits.max._0_4_ = (uint)uVar15;
      local_298.limits.max._4_4_ = (undefined4)(uVar15 >> 0x20);
      Memory::New((Ptr *)&extern_,(Store *)this,&local_298);
      value.field_0.ref_ = RefPtr<wabt::interp::Memory>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar30,(Ref *)&value);
      RefPtr<wabt::interp::Memory>::reset((Ptr *)&extern_);
    }
    pGVar5 = ((mod.obj_)->desc_).globals.
             super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar31 = (Instance *)(local_210 + 0xf0);
    for (pGVar25 = ((mod.obj_)->desc_).globals.
                   super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pGVar25 != pGVar5;
        pGVar25 = pGVar25 + 1) {
      value.field_0.i64_ = 0;
      value.field_0._8_8_ = 0;
      RVar21 = RefPtr<wabt::interp::Instance>::ref(&inst);
      FuncDesc::FuncDesc((FuncDesc *)pIVar31,&pGVar25->init_func);
      DefinedFunc::New((Ptr *)&extern_,(Store *)this,RVar21,(FuncDesc *)pIVar31);
      RVar21 = RefPtr<wabt::interp::DefinedFunc>::ref((Ptr *)&extern_);
      RefPtr<wabt::interp::DefinedFunc>::reset((Ptr *)&extern_);
      pIVar29 = pIVar31;
      FuncDesc::~FuncDesc((FuncDesc *)pIVar31);
      RVar18 = CallInitFunc(pIVar29,(Store *)this,RVar21,&value,(Ptr *)imports);
      if (RVar18.enum_ == Error) {
LAB_00123fc8:
        __return_storage_ptr__->obj_ = (Instance *)0x0;
        __return_storage_ptr__->store_ = (Store *)0x0;
        __return_storage_ptr__->root_index_ = 0;
        goto LAB_00123fd0;
      }
      pRVar30 = &(inst.obj_)->globals_;
      local_2b0 = (pGVar25->type).super_ExternType.kind;
      local_2b8 = &PTR__ExternType_00186180;
      local_2a4 = (pGVar25->type).mut;
      local_2ac = *(undefined8 *)&(pGVar25->type).super_ExternType.field_0xc;
      value_00.field_0._8_8_ = out_trap;
      value_00.field_0.i64_ = value.field_0._8_8_;
      Global::New((Ptr *)&extern_,(Global *)this,(Store *)&local_2b8,
                  (GlobalType *)value.field_0.i64_,value_00);
      local_2d8.obj_ =
           (Trap *)RefPtr<wabt::interp::Global>::ref((RefPtr<wabt::interp::Global> *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar30,(Ref *)&local_2d8);
      RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&extern_);
    }
    pTVar6 = &(((mod.obj_)->desc_).tags.
               super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>.
               _M_impl.super__Vector_impl_data._M_finish)->type;
    for (pTVar26 = &(((mod.obj_)->desc_).tags.
                     super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start)->type; pTVar26 != pTVar6;
        pTVar26 = pTVar26 + 1) {
      pRVar30 = &(inst.obj_)->tags_;
      TagType::TagType(&local_238,pTVar26);
      Tag::New((Ptr *)&extern_,(Store *)this,&local_238);
      value.field_0.ref_ = RefPtr<wabt::interp::Tag>::ref((Ptr *)&extern_);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(pRVar30,(Ref *)&value);
      RefPtr<wabt::interp::Tag>::reset((Ptr *)&extern_);
      TagType::~TagType(&local_238);
    }
    pEVar7 = ((mod.obj_)->desc_).exports.
             super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pEVar33 = ((mod.obj_)->desc_).exports.
                   super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pEVar33 != pEVar7;
        pEVar33 = pEVar33 + 1) {
      switch(((pEVar33->type).type._M_t.
              super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
              .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind) {
      case First:
        uVar19 = (ulong)pEVar33->index;
        pRVar22 = ((inst.obj_)->funcs_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Table:
        uVar19 = (ulong)pEVar33->index;
        pRVar22 = ((inst.obj_)->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Memory:
        uVar19 = (ulong)pEVar33->index;
        pRVar22 = ((inst.obj_)->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Global:
        uVar19 = (ulong)pEVar33->index;
        pRVar22 = ((inst.obj_)->globals_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      case Last:
        uVar19 = (ulong)pEVar33->index;
        pRVar22 = ((inst.obj_)->tags_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      default:
        goto switchD_00123bed_default;
      }
      extern_.obj_ = (Extern *)pRVar22[uVar19].index;
switchD_00123bed_default:
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&(inst.obj_)->exports_,(value_type *)&extern_);
    }
    pEVar8 = ((mod.obj_)->desc_).elems.
             super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pEVar38 = ((mod.obj_)->desc_).elems.
                   super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pEVar38 != pEVar8;
        pEVar38 = pEVar38 + 1) {
      extern_.obj_ = (Extern *)pEVar38;
      std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
      emplace_back<wabt::interp::Store&,wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                 &(inst.obj_)->elems_,(Store *)this,(ElemDesc **)&extern_,&inst);
    }
    pDVar9 = ((mod.obj_)->desc_).datas.
             super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pDVar34 = ((mod.obj_)->desc_).datas.
                   super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar34 != pDVar9;
        pDVar34 = pDVar34 + 1) {
      extern_.obj_ = (Extern *)pDVar34;
      std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
      emplace_back<wabt::interp::DataDesc_const*>
                ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                 &(inst.obj_)->datas_,(DataDesc **)&extern_);
    }
    for (uVar35 = (uint)*(byte *)((long)&(this->super_Object).kind_ + 1); uVar35 != 2;
        uVar35 = uVar35 + 1) {
      pEVar10 = ((inst.obj_)->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((inst.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar10; src = src + 1) {
        pEVar11 = src->desc_;
        if (pEVar11->mode == Declared) {
          pRVar22 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar22) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar22;
          }
        }
        else if (pEVar11->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)&value,(Store *)this,
                     (Ref)((inst.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar11->table_index].index);
          value_1.field_0.i64_ = 0;
          value_1.field_0._8_8_ = 0;
          RVar21 = RefPtr<wabt::interp::Instance>::ref(&inst);
          pIVar31 = (Instance *)(local_210 + 0x78);
          FuncDesc::FuncDesc((FuncDesc *)pIVar31,&pEVar11->init_func);
          DefinedFunc::New((Ptr *)&extern_,(Store *)this,RVar21,(FuncDesc *)pIVar31);
          RVar21 = RefPtr<wabt::interp::DefinedFunc>::ref((Ptr *)&extern_);
          RefPtr<wabt::interp::DefinedFunc>::reset((Ptr *)&extern_);
          FuncDesc::~FuncDesc((FuncDesc *)pIVar31);
          pIVar29 = this;
          RVar18 = CallInitFunc(pIVar31,(Store *)this,RVar21,&value_1,(Ptr *)imports);
          if (RVar18.enum_ == Error) {
            __return_storage_ptr__->obj_ = (Instance *)0x0;
            __return_storage_ptr__->store_ = (Store *)0x0;
            __return_storage_ptr__->root_index_ = 0;
LAB_001240cf:
            RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)&value);
            goto LAB_00123fd0;
          }
          uVar27 = value_1.field_0.i64_;
          if (*(char *)(value.field_0.i64_ + 0x6a) == '\0') {
            uVar27 = value_1.field_0.i64_ & 0xffffffff;
          }
          if (uVar35 == 0) {
            uVar28 = *(long *)(value.field_0.i64_ + 0x78) - *(long *)(value.field_0.i64_ + 0x70) >>
                     3;
            uVar19 = (ulong)((long)(src->elements_).
                                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(src->elements_).
                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
            RVar18.enum_ = (Enum)(uVar28 - uVar19 < (value_1.field_0.i64_ & 0xffffffff) ||
                                 uVar28 < uVar19);
LAB_00123e49:
            if (RVar18.enum_ == Error) {
              StringPrintf_abi_cxx11_
                        ((string *)&extern_,
                         "out of bounds table access: elem segment is out of bounds: [%lu, %lu) >= max value %u"
                         ,uVar27,((ulong)((long)(src->elements_).
                                                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(src->elements_).
                                               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3 &
                                 0xffffffff) + uVar27,
                         (ulong)(*(long *)(value.field_0.i64_ + 0x78) -
                                *(long *)(value.field_0.i64_ + 0x70)) >> 3);
              extern_ref.index = 0;
              Trap::New(&local_2d8,(Store *)this,(string *)&extern_,
                        (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                        &extern_ref);
              (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8.obj_;
              (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8.store_;
              (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2d8.root_index_;
              local_2d8.obj_ = (Trap *)0x0;
              local_2d8.store_ = (Store *)0x0;
              local_2d8.root_index_ = 0;
              RefPtr<wabt::interp::Trap>::reset(&local_2d8);
              std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::
              ~_Vector_base((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                             *)&extern_ref);
              std::__cxx11::string::_M_dispose();
              __return_storage_ptr__->obj_ = (Instance *)0x0;
              __return_storage_ptr__->store_ = (Store *)0x0;
              __return_storage_ptr__->root_index_ = 0;
              goto LAB_001240cf;
            }
          }
          else {
            RVar18 = Table::Init((Table *)value.field_0.i64_,(Store *)pIVar29,(u32)uVar27,src,0,
                                 (u32)((ulong)((long)(src->elements_).
                                                                                                          
                                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(src->elements_).
                                                                                                        
                                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
            if (RVar18.enum_ != Ok) goto LAB_00123e49;
            pRVar22 = (src->elements_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish != pRVar22) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar22;
            }
          }
          RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)&value);
        }
      }
      pDVar12 = ((inst.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src_00 = ((inst.obj_)->datas_).
                    super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start; src_00 != pDVar12;
          src_00 = src_00 + 1) {
        pDVar13 = src_00->desc_;
        if (pDVar13->mode == Declared) {
          src_00->size_ = 0;
        }
        else if (pDVar13->mode == Active) {
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&value,(Store *)this,
                     (Ref)((inst.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar13->memory_index].index);
          value_1.field_0.i64_ = 0;
          value_1.field_0._8_8_ = 0;
          RVar21 = RefPtr<wabt::interp::Instance>::ref(&inst);
          pIVar31 = (Instance *)local_210;
          FuncDesc::FuncDesc((FuncDesc *)pIVar31,&pDVar13->init_func);
          DefinedFunc::New((Ptr *)&extern_,(Store *)this,RVar21,(FuncDesc *)pIVar31);
          RVar21 = RefPtr<wabt::interp::DefinedFunc>::ref((Ptr *)&extern_);
          RefPtr<wabt::interp::DefinedFunc>::reset((Ptr *)&extern_);
          FuncDesc::~FuncDesc((FuncDesc *)pIVar31);
          RVar18 = CallInitFunc(pIVar31,(Store *)this,RVar21,&value_1,(Ptr *)imports);
          if (RVar18.enum_ == Error) {
            __return_storage_ptr__->obj_ = (Instance *)0x0;
            __return_storage_ptr__->store_ = (Store *)0x0;
            __return_storage_ptr__->root_index_ = 0;
LAB_0012419f:
            RefPtr<wabt::interp::Memory>::reset((RefPtr<wabt::interp::Memory> *)&value);
            goto LAB_00123fd0;
          }
          uVar27 = value_1.field_0.i64_ & 0xffffffff;
          if (*(char *)(value.field_0.i64_ + 0x62) != '\0') {
            uVar27 = value_1.field_0.i64_;
          }
          if (uVar35 == 0) {
            bVar16 = Memory::IsValidAccess((Memory *)value.field_0.i64_,uVar27,0,src_00->size_);
            RVar18.enum_ = (Enum)!bVar16;
LAB_00123f92:
            if (RVar18.enum_ == Error) {
              StringPrintf_abi_cxx11_
                        ((string *)&extern_,
                         "out of bounds memory access: data segment is out of bounds: [%lu, %lu) >= max value %lu"
                         ,uVar27,src_00->size_ + uVar27,
                         *(long *)(value.field_0.i64_ + 0x78) - *(long *)(value.field_0.i64_ + 0x70)
                        );
              extern_ref.index = 0;
              Trap::New(&local_2d8,(Store *)this,(string *)&extern_,
                        (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                        &extern_ref);
              (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8.obj_;
              (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8.store_;
              (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2d8.root_index_;
              local_2d8.obj_ = (Trap *)0x0;
              local_2d8.store_ = (Store *)0x0;
              local_2d8.root_index_ = 0;
              RefPtr<wabt::interp::Trap>::reset(&local_2d8);
              std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::
              ~_Vector_base((_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                             *)&extern_ref);
              std::__cxx11::string::_M_dispose();
              __return_storage_ptr__->obj_ = (Instance *)0x0;
              __return_storage_ptr__->store_ = (Store *)0x0;
              __return_storage_ptr__->root_index_ = 0;
              goto LAB_0012419f;
            }
          }
          else {
            RVar18 = Memory::Init((Memory *)value.field_0.i64_,uVar27,src_00,0,src_00->size_);
            if (RVar18.enum_ != Ok) goto LAB_00123f92;
            src_00->size_ = 0;
          }
          RefPtr<wabt::interp::Memory>::reset((RefPtr<wabt::interp::Memory> *)&value);
        }
      }
    }
    pSVar32 = ((mod.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar14 = ((mod.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pSVar32 == pSVar14) {
        __return_storage_ptr__->obj_ = inst.obj_;
        __return_storage_ptr__->store_ = inst.store_;
        __return_storage_ptr__->root_index_ = inst.root_index_;
        inst.obj_ = (Instance *)0x0;
        inst.store_ = (Store *)0x0;
        inst.root_index_ = 0;
        goto LAB_00123fd0;
      }
      RefPtr<wabt::interp::Func>::RefPtr
                ((RefPtr<wabt::interp::Func> *)&extern_,(Store *)this,
                 (Ref)((inst.obj_)->funcs_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start[pSVar32->func_index].index);
      value.field_0.i64_ = 0;
      value.field_0._8_8_ = 0;
      local_2d8.obj_ = (Trap *)0x0;
      local_2d8.store_ = (Store *)0x0;
      local_2d8.root_index_ = 0;
      RVar18 = Func::Call((Func *)extern_.obj_,(Store *)this,(Values *)&local_2d8,(Values *)&value,
                          (Ptr *)imports,(Stream *)0x0);
      std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                 &local_2d8);
      if (RVar18.enum_ == Error) break;
      std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&value);
      RefPtr<wabt::interp::Func>::reset((RefPtr<wabt::interp::Func> *)&extern_);
      pSVar32 = pSVar32 + 1;
    }
    __return_storage_ptr__->obj_ = (Instance *)0x0;
    __return_storage_ptr__->store_ = (Store *)0x0;
    __return_storage_ptr__->root_index_ = 0;
    std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
              ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&value);
    RefPtr<wabt::interp::Func>::reset((RefPtr<wabt::interp::Func> *)&extern_);
  }
LAB_00123fd0:
  RefPtr<wabt::interp::Instance>::reset(&inst);
  RefPtr<wabt::interp::Module>::reset(&mod);
  return __return_storage_ptr__;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Tag:    inst->tags_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    Value value;
    Ref func_ref = DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
    if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
      return {};
    }
    inst->globals_.push_back(Global::New(store, desc.type, value).ref());
  }

  // Tags.
  for (auto&& desc : mod->desc().tags) {
    inst->tags_.push_back(Tag::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports) {
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Tag:    ref = inst->tags_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(store, &desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  // The MVP requires that all segments are bounds-checked before being copied
  // into the table or memory. The bulk memory proposal changes this behavior;
  // instead, each segment is copied in order. If any segment fails, then no
  // further segments are copied. Any data that was written persists.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        Value value;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
          return {};
        }

        u64 offset;
        if (table->type().limits.is_64) {
          offset = value.Get<u64>();
        } else {
          offset = value.Get<u32>();
        }

        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds table access: elem segment is "
                           "out of bounds: [%" PRIu64 ", %" PRIu64
                           ") >= max value %u",
                           offset, offset + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        Value offset_op;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &offset_op, out_trap))) {
          return {};
        }
        u64 offset = memory->type().limits.is_64 ? offset_op.Get<u64>()
                                                 : offset_op.Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds memory access: data segment is "
                         "out of bounds: [%" PRIu64 ", %" PRIu64
                         ") >= max value %" PRIu64,
                         offset, offset + segment.size(), memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}